

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestTailCallerImpl::foo(TestTailCallerImpl *this,FooContext context)

{
  undefined4 uVar1;
  CallContextHook *in_RDX;
  Reader value;
  FooContext context_local;
  undefined1 local_b0 [24];
  Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  tailRequest;
  Reader params;
  Maybe<capnp::MessageSize> local_30;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  context_local.hook = in_RDX;
  CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::getParams(&params,&context_local);
  capnproto_test::capnp::test::TestTailCaller::FooParams::Reader::getCallee
            ((Client *)local_b0,&params);
  local_30.ptr.isSet = false;
  capnproto_test::capnp::test::TestTailCallee::Client::fooRequest
            (&tailRequest,(Client *)local_b0,&local_30);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_b0 + 8));
  uVar1 = 0;
  if (0x1f < params._reader.dataSize) {
    uVar1 = *params._reader.data;
  }
  *(undefined4 *)tailRequest.super_Builder._builder.data = uVar1;
  value.super_StringPtr.content.size_ = 0x14;
  value.super_StringPtr.content.ptr = "from TestTailCaller";
  capnproto_test::capnp::test::TestTailCallee::FooParams::Builder::setT
            (&tailRequest.super_Builder,value);
  (*(context_local.hook)->_vptr_CallContextHook[3])(this,context_local.hook,&tailRequest.hook);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&tailRequest.hook);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestTailCallerImpl::foo(FooContext context) {
  ++callCount;

  auto params = context.getParams();
  auto tailRequest = params.getCallee().fooRequest();
  tailRequest.setI(params.getI());
  tailRequest.setT("from TestTailCaller");
  return context.tailCall(kj::mv(tailRequest));
}